

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion __thiscall QRegion::united(QRegion *this,QRect *r)

{
  long lVar1;
  bool bVar2;
  QRegionPrivate *in_RDX;
  QRegionPrivate *in_RSI;
  QRegionPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegion *result;
  QRegionPrivate rp;
  QRect *in_stack_ffffffffffffff78;
  QRegionPrivate *dest;
  undefined5 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 uVar3;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  QRegionPrivate *this_00;
  QRegionPrivate *this_01;
  undefined1 local_48 [24];
  QRect *in_stack_ffffffffffffffd0;
  QRegionPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dest = in_RDI;
  this_00 = in_RSI;
  this_01 = in_RDI;
  bVar2 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RSI + 8));
  if (bVar2) {
    QRegion((QRegion *)this_01,(QRect *)this_00,(RegionType)((ulong)in_RDX >> 0x20));
  }
  else {
    bVar2 = QRect::isEmpty((QRect *)in_RDI);
    if (bVar2) {
      QRegion((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffff78);
    }
    else {
      bVar2 = QRegionPrivate::contains
                        (in_RDX,(QRect *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT15(in_stack_ffffffffffffff9d,
                                                                    in_stack_ffffffffffffff98))));
      if (bVar2) {
        QRegion((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffff78);
      }
      else {
        bVar2 = QRegionPrivate::within
                          (in_RDX,(QRect *)CONCAT17(in_stack_ffffffffffffff9f,
                                                    CONCAT16(in_stack_ffffffffffffff9e,
                                                             CONCAT15(in_stack_ffffffffffffff9d,
                                                                      in_stack_ffffffffffffff98))));
        if (bVar2) {
          QRegion((QRegion *)this_01,(QRect *)this_00,(RegionType)((ulong)in_RDX >> 0x20));
        }
        else if ((**(int **)(*(long *)in_RSI + 8) == 1) &&
                (bVar2 = ::operator==((QRect *)in_RDI,in_stack_ffffffffffffff78), bVar2)) {
          QRegion((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffff78);
        }
        else {
          bVar2 = QRegionPrivate::canAppend(this_00,(QRect *)in_RDX);
          if (bVar2) {
            *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
            QRegion((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffff78);
            detach((QRegion *)in_RDI);
            QRegionPrivate::append(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
          }
          else {
            bVar2 = QRegionPrivate::canPrepend(this_00,(QRect *)in_RDX);
            if (bVar2) {
              *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
              QRegion((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffff78);
              detach((QRegion *)in_RDI);
              QRegionPrivate::prepend(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
            }
            else {
              uVar3 = 0;
              *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
              QRegion((QRegion *)in_RDI);
              detach((QRegion *)in_RDI);
              memset(local_48,0xaa,0x40);
              QRegionPrivate::QRegionPrivate(in_RSI,(QRect *)dest);
              UnionRegion((QRegionPrivate *)
                          CONCAT17(in_stack_ffffffffffffff9f,
                                   CONCAT16(in_stack_ffffffffffffff9e,
                                            CONCAT15(uVar3,in_stack_ffffffffffffff98))),in_RSI,dest)
              ;
              bVar4 = 1;
              QRegionPrivate::~QRegionPrivate((QRegionPrivate *)0x6514b6);
              if ((bVar4 & 1) == 0) {
                ~QRegion((QRegion *)in_RDI);
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QRegion)(QRegionData *)dest;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::united(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (r.isEmpty())
        return *this;

    if (d->qt_rgn->contains(r)) {
        return *this;
    } else if (d->qt_rgn->within(r)) {
        return r;
    } else if (d->qt_rgn->numRects == 1 && d->qt_rgn->extents == r) {
        return *this;
    } else if (d->qt_rgn->canAppend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(&r);
        return result;
    } else if (d->qt_rgn->canPrepend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(&r);
        return result;
    } else {
        QRegion result;
        result.detach();
        QRegionPrivate rp(r);
        UnionRegion(d->qt_rgn, &rp, *result.d->qt_rgn);
        return result;
    }
}